

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usda-reader.cc
# Opt level: O0

bool __thiscall tinyusdz::usda::USDAReader::Impl::GetAsLayer(Impl *this,Layer *layer)

{
  ulong uVar1;
  bool bVar2;
  ostream *poVar3;
  StageMetas *pSVar4;
  LayerMetas *this_00;
  reference puVar5;
  size_type sVar6;
  reference parent;
  string *psVar7;
  reference ps;
  string local_890;
  allocator local_869;
  string local_868 [32];
  fmt local_848 [32];
  ostringstream local_828 [8];
  ostringstream ss_e_4;
  string local_6b0;
  ostringstream local_690 [8];
  ostringstream ss_e_3;
  PrimSpec *primSpec;
  value_type *node;
  ostringstream local_4e8 [8];
  ostringstream ss_e_2;
  unsigned_long *idx;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  ostringstream local_330 [8];
  ostringstream ss_e_1;
  string local_1b8;
  ostringstream local_198 [8];
  ostringstream ss_e;
  Layer *layer_local;
  Impl *this_local;
  
  if (layer == (Layer *)0x0) {
    ::std::__cxx11::ostringstream::ostringstream(local_198);
    poVar3 = ::std::operator<<((ostream *)local_198,"[error]");
    poVar3 = ::std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usda-reader.cc"
                              );
    poVar3 = ::std::operator<<(poVar3,":");
    poVar3 = ::std::operator<<(poVar3,"GetAsLayer");
    poVar3 = ::std::operator<<(poVar3,"():");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x56b);
    ::std::operator<<(poVar3," ");
    poVar3 = ::std::operator<<((ostream *)local_198,"layer arg is nullptr.");
    ::std::operator<<(poVar3,"\n");
    ::std::__cxx11::ostringstream::str();
    PushError(this,&local_1b8);
    ::std::__cxx11::string::~string((string *)&local_1b8);
    this_local._7_1_ = false;
    ::std::__cxx11::ostringstream::~ostringstream(local_198);
  }
  else if ((this->_primspec_invalidated & 1U) == 0) {
    Layer::clear_primspecs(layer);
    pSVar4 = Stage::metas(&this->_stage);
    this_00 = Layer::metas(layer);
    LayerMetas::operator=(this_00,pSVar4);
    __end2._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                    &this->_toplevel_primspecs);
    idx = (unsigned_long *)
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     &this->_toplevel_primspecs);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                       *)&idx), bVar2) {
      puVar5 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&__end2);
      uVar1 = *puVar5;
      sVar6 = ::std::
              vector<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode,_std::allocator<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode>_>
              ::size(&this->_primspec_nodes);
      if (sVar6 <= uVar1) {
        ::std::__cxx11::ostringstream::ostringstream(local_4e8);
        poVar3 = ::std::operator<<((ostream *)local_4e8,"[error]");
        poVar3 = ::std::operator<<(poVar3,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usda-reader.cc"
                                  );
        poVar3 = ::std::operator<<(poVar3,":");
        poVar3 = ::std::operator<<(poVar3,"GetAsLayer");
        poVar3 = ::std::operator<<(poVar3,"():");
        poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x57a);
        ::std::operator<<(poVar3," ");
        poVar3 = ::std::operator<<((ostream *)local_4e8,"[Internal Error] out-of-bounds access.");
        ::std::operator<<(poVar3,"\n");
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)&node);
        ::std::__cxx11::string::~string((string *)&node);
        ::std::__cxx11::ostringstream::~ostringstream(local_4e8);
        return false;
      }
      parent = ::std::
               vector<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode,_std::allocator<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode>_>
               ::operator[](&this->_primspec_nodes,*puVar5);
      bVar2 = anon_unknown_1::ToPrimSpecRec
                        (*puVar5,&this->_primspec_nodes,&parent->primSpec,&this->_err);
      if (!bVar2) {
        this->_primspec_invalidated = true;
        ::std::__cxx11::ostringstream::ostringstream(local_690);
        poVar3 = ::std::operator<<((ostream *)local_690,"[error]");
        poVar3 = ::std::operator<<(poVar3,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usda-reader.cc"
                                  );
        poVar3 = ::std::operator<<(poVar3,":");
        poVar3 = ::std::operator<<(poVar3,"GetAsLayer");
        poVar3 = ::std::operator<<(poVar3,"():");
        poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x586);
        ::std::operator<<(poVar3," ");
        poVar3 = ::std::operator<<((ostream *)local_690,"Construct PrimSpec tree failed.");
        ::std::operator<<(poVar3,"\n");
        ::std::__cxx11::ostringstream::str();
        PushError(this,&local_6b0);
        ::std::__cxx11::string::~string((string *)&local_6b0);
        ::std::__cxx11::ostringstream::~ostringstream(local_690);
        return false;
      }
      psVar7 = PrimSpec::name_abi_cxx11_(&parent->primSpec);
      ps = ::std::
           vector<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode,_std::allocator<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode>_>
           ::operator[](&this->_primspec_nodes,*puVar5);
      bVar2 = Layer::emplace_primspec(layer,psVar7,&ps->primSpec);
      if (!bVar2) {
        ::std::__cxx11::ostringstream::ostringstream(local_828);
        poVar3 = ::std::operator<<((ostream *)local_828,"[error]");
        poVar3 = ::std::operator<<(poVar3,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usda-reader.cc"
                                  );
        poVar3 = ::std::operator<<(poVar3,":");
        poVar3 = ::std::operator<<(poVar3,"GetAsLayer");
        poVar3 = ::std::operator<<(poVar3,"():");
        poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x58a);
        ::std::operator<<(poVar3," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_868,"Construct PrimSpec tree failed: PrimSpec.name = {}",&local_869);
        psVar7 = PrimSpec::name_abi_cxx11_(&parent->primSpec);
        fmt::format<std::__cxx11::string>
                  (local_848,(string *)local_868,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar7);
        poVar3 = ::std::operator<<((ostream *)local_828,(string *)local_848);
        ::std::operator<<(poVar3,"\n");
        ::std::__cxx11::string::~string((string *)local_848);
        ::std::__cxx11::string::~string(local_868);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_869);
        ::std::__cxx11::ostringstream::str();
        PushError(this,&local_890);
        ::std::__cxx11::string::~string((string *)&local_890);
        ::std::__cxx11::ostringstream::~ostringstream(local_828);
        return false;
      }
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&__end2);
    }
    this->_primspec_invalidated = true;
    this_local._7_1_ = true;
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream(local_330);
    poVar3 = ::std::operator<<((ostream *)local_330,"[error]");
    poVar3 = ::std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usda-reader.cc"
                              );
    poVar3 = ::std::operator<<(poVar3,":");
    poVar3 = ::std::operator<<(poVar3,"GetAsLayer");
    poVar3 = ::std::operator<<(poVar3,"():");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x56f);
    ::std::operator<<(poVar3," ");
    poVar3 = ::std::operator<<((ostream *)local_330,
                               "PrimSpec data is invalid. USD data is not loaded or there was an error in earlier GetAsLayer call, or GetAsLayer was invoked multiple times."
                              );
    ::std::operator<<(poVar3,"\n");
    ::std::__cxx11::ostringstream::str();
    PushError(this,(string *)&__range2);
    ::std::__cxx11::string::~string((string *)&__range2);
    this_local._7_1_ = false;
    ::std::__cxx11::ostringstream::~ostringstream(local_330);
  }
  return this_local._7_1_;
}

Assistant:

bool USDAReader::Impl::GetAsLayer(Layer *layer) {

  if (!layer) {
    PUSH_ERROR_AND_RETURN("layer arg is nullptr.");
  }

  if (_primspec_invalidated) {
    PUSH_ERROR_AND_RETURN("PrimSpec data is invalid. USD data is not loaded or there was an error in earlier GetAsLayer call, or GetAsLayer was invoked multiple times.");
  }

  layer->clear_primspecs();
  DCOUT("# of subLayers = " << _stage.metas().subLayers.size());
  layer->metas() = _stage.metas();

  for (const auto &idx : _toplevel_primspecs) {
    DCOUT("Toplevel primspec idx: " << std::to_string(idx));

    if (idx >= _primspec_nodes.size()) {
      PUSH_ERROR_AND_RETURN("[Internal Error] out-of-bounds access.");
    }

    auto &node = _primspec_nodes[idx];
    PrimSpec &primSpec = node.primSpec;

    DCOUT("primspec[" << idx << "].typeName = " << primSpec.typeName());
    DCOUT("primspec[" << idx << "].name = " << primSpec.name());
    DCOUT("root prim[" << idx << "].num_children = " << primSpec.children().size());

    if (!ToPrimSpecRec(idx, _primspec_nodes, /* inout */primSpec, &_err)) {
      _primspec_invalidated = true;
      PUSH_ERROR_AND_RETURN("Construct PrimSpec tree failed.");
    }

    if (!layer->emplace_primspec(primSpec.name(), std::move(_primspec_nodes[idx].primSpec))) {
      PUSH_ERROR_AND_RETURN(fmt::format("Construct PrimSpec tree failed: PrimSpec.name = {}", primSpec.name()));
    }
  }

  // NOTE: _toplevel_primspecs are destroyed(std::move'ed)
  _primspec_invalidated = true;

  return true;
}